

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deCommandLine.c
# Opt level: O1

deCommandLine * deCommandLine_parse(char *commandLine)

{
  char *pcVar1;
  char cVar2;
  uint uVar3;
  bool bVar4;
  deBool dVar5;
  deMemPool *pool;
  dePoolArray *arr;
  size_t sVar6;
  char *ptr;
  char *pcVar7;
  deCommandLine *ptr_00;
  char **ppcVar8;
  long lVar9;
  char cVar10;
  int iVar11;
  int iVar12;
  
  arr = (dePoolArray *)0x0;
  pool = deMemPool_createRoot((deMemPoolUtil *)0x0,0);
  if (pool != (deMemPool *)0x0) {
    arr = dePoolArray_create(pool,8);
  }
  if (arr == (dePoolArray *)0x0) {
    if (pool == (deMemPool *)0x0) {
      return (deCommandLine *)0x0;
    }
  }
  else {
    sVar6 = strlen(commandLine);
    ptr = (char *)deCalloc(sVar6 + 1);
    if ((ptr != (char *)0x0) &&
       ((iVar11 = arr->numElements + 1, iVar11 <= arr->capacity ||
        (dVar5 = dePoolArray_reserve(arr,iVar11), dVar5 != 0)))) {
      uVar3 = arr->numElements;
      arr->numElements = uVar3 + 1;
      *(char **)((long)arr->pageTable[(int)uVar3 >> 4] + (ulong)(uVar3 & 0xf) * 8) = ptr;
      iVar11 = 0;
      cVar10 = '\0';
      pcVar7 = ptr;
      while (cVar2 = commandLine[iVar11], cVar2 != '\0') {
        iVar12 = iVar11 + 1;
        if (cVar2 == '\\' && cVar10 != '\0') {
          cVar2 = commandLine[iVar12];
          if (cVar2 == 't') {
            *pcVar7 = '\t';
          }
          else if (cVar2 == 'n') {
            *pcVar7 = '\n';
          }
          else {
            *pcVar7 = cVar2;
          }
          bVar4 = true;
          pcVar7 = pcVar7 + 1;
          iVar11 = iVar11 + 2;
          cVar2 = cVar10;
        }
        else {
          bVar4 = true;
          iVar11 = iVar12;
          if (cVar2 == cVar10) {
            cVar2 = '\0';
          }
          else if ((cVar10 != '\0') || ((cVar2 != '\"' && (cVar2 != '\'')))) {
            pcVar1 = pcVar7 + 1;
            if (cVar2 == ' ' && cVar10 == '\0') {
              *pcVar7 = '\0';
              iVar12 = arr->numElements + 1;
              if ((arr->capacity < iVar12) && (dVar5 = dePoolArray_reserve(arr,iVar12), dVar5 == 0))
              {
                deFree(ptr);
                deMemPool_destroy(pool);
                bVar4 = false;
                pcVar7 = pcVar1;
                cVar2 = cVar10;
              }
              else {
                uVar3 = arr->numElements;
                arr->numElements = uVar3 + 1;
                *(char **)((long)arr->pageTable[(int)uVar3 >> 4] + (ulong)(uVar3 & 0xf) * 8) =
                     pcVar1;
                pcVar7 = pcVar1;
                cVar2 = cVar10;
              }
            }
            else {
              *pcVar7 = cVar2;
              pcVar7 = pcVar1;
              cVar2 = cVar10;
            }
          }
        }
        cVar10 = cVar2;
        if (!bVar4) {
          return (deCommandLine *)0x0;
        }
      }
      *pcVar7 = '\0';
      ptr_00 = (deCommandLine *)deCalloc(0x18);
      if (ptr_00 != (deCommandLine *)0x0) {
        ppcVar8 = (char **)deCalloc((long)arr->numElements << 3);
        ptr_00->args = ppcVar8;
        if (ppcVar8 != (char **)0x0) {
          iVar11 = arr->numElements;
          ptr_00->numArgs = iVar11;
          ptr_00->argBuf = ptr;
          if (0 < (long)iVar11) {
            lVar9 = 0;
            do {
              ptr_00->args[lVar9] =
                   *(char **)((long)arr->pageTable[(int)(uint)lVar9 >> 4] +
                             (ulong)((uint)lVar9 & 0xf) * 8);
              lVar9 = lVar9 + 1;
            } while (iVar11 != lVar9);
          }
          deMemPool_destroy(pool);
          return ptr_00;
        }
      }
      deFree(ptr_00);
      deFree(ptr);
    }
  }
  deMemPool_destroy(pool);
  return (deCommandLine *)0x0;
}

Assistant:

deCommandLine* deCommandLine_parse (const char* commandLine)
{
	deMemPool*		tmpPool		= deMemPool_createRoot(DE_NULL, 0);
	CharPtrArray*	args		= tmpPool ? CharPtrArray_create(tmpPool) : DE_NULL;
	char*			buf			= DE_NULL;
	char*			outPtr;
	int				pos;
	int				argNdx;
	char			strChr;

	if (!args)
	{
		if (tmpPool)
			deMemPool_destroy(tmpPool);
		return DE_NULL;
	}

	DE_ASSERT(commandLine);

	/* Create buffer for args (no expansion can happen). */
	buf		= (char*)deCalloc(strlen(commandLine)+1);
	pos		= 0;
	argNdx	= 0;
	outPtr	= buf;
	strChr	= 0;

	if (!buf || !CharPtrArray_pushBack(args, buf))
	{
		deMemPool_destroy(tmpPool);
		return DE_NULL;
	}

	while (commandLine[pos] != 0)
	{
		char c = commandLine[pos++];

		if (strChr != 0 && c == '\\')
		{
			/* Escape. */
			c = commandLine[pos++];
			switch (c)
			{
				case 'n':	*outPtr++ = '\n';	break;
				case 't':	*outPtr++ = '\t';	break;
				default:	*outPtr++ = c;		break;
			}
		}
		else if (strChr != 0 && c == strChr)
		{
			/* String end. */
			strChr = 0;
		}
		else if (strChr == 0 && (c == '"' || c == '\''))
		{
			/* String start. */
			strChr = c;
		}
		else if (c == ' ' && strChr == 0)
		{
			/* Arg end. */
			*outPtr++		 = 0;
			argNdx			+= 1;
			if (!CharPtrArray_pushBack(args, outPtr))
			{
				deFree(buf);
				deMemPool_destroy(tmpPool);
				return DE_NULL;
			}
		}
		else
			*outPtr++ = c;
	}

	DE_ASSERT(commandLine[pos] == 0);

	/* Terminate last arg. */
	*outPtr = 0;

	/* Create deCommandLine. */
	{
		deCommandLine* cmdLine = (deCommandLine*)deCalloc(sizeof(deCommandLine));

		if (!cmdLine || !(cmdLine->args = (char**)deCalloc(sizeof(char*)*(size_t)CharPtrArray_getNumElements(args))))
		{
			deFree(cmdLine);
			deFree(buf);
			deMemPool_destroy(tmpPool);
			return DE_NULL;
		}

		cmdLine->numArgs	= CharPtrArray_getNumElements(args);
		cmdLine->argBuf		= buf;

		for (argNdx = 0; argNdx < cmdLine->numArgs; argNdx++)
			cmdLine->args[argNdx] = CharPtrArray_get(args, argNdx);

		deMemPool_destroy(tmpPool);
		return cmdLine;
	}
}